

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseBase.h
# Opt level: O0

void __thiscall
Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::DenseBase
          (DenseBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *this)

{
  DenseBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *this_local;
  
  return;
}

Assistant:

EIGEN_DEVICE_FUNC DenseBase()
    {
      /* Just checks for self-consistency of the flags.
       * Only do it when debugging Eigen, as this borders on paranoia and could slow compilation down
       */
#ifdef EIGEN_INTERNAL_DEBUGGING
      EIGEN_STATIC_ASSERT((EIGEN_IMPLIES(MaxRowsAtCompileTime==1 && MaxColsAtCompileTime!=1, int(IsRowMajor))
                        && EIGEN_IMPLIES(MaxColsAtCompileTime==1 && MaxRowsAtCompileTime!=1, int(!IsRowMajor))),
                          INVALID_STORAGE_ORDER_FOR_THIS_VECTOR_EXPRESSION)
#endif
    }